

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::BlendTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BlendTestInstance *this)

{
  _func_int **pp_Var1;
  pointer pVVar2;
  TestLog *log;
  bool bVar3;
  int i;
  VkResult VVar4;
  deUint32 dVar5;
  TextureChannelClass TVar6;
  TextureChannelClass TVar7;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  VkQueue pVVar10;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  TestStatus *pTVar11;
  long lVar12;
  long lVar13;
  ChannelOrder CVar14;
  undefined4 uVar15;
  ChannelType CVar16;
  TextureFormat tcuColorFormat;
  Vec4 threshold;
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  TextureFormat tcuDepthFormat;
  size_type __dnew;
  RenderState renderState;
  ColorVertexShader vertexShader;
  Program program;
  ColorFragmentShader fragmentShader;
  ReferenceRenderer refRenderer;
  VkSubmitInfo submitInfo;
  TextureFormat local_650;
  TextureFormat local_648;
  VkMemoryType VStack_640;
  TestStatus *local_630;
  undefined1 local_628 [40];
  UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> local_600;
  TextureFormat local_5f0;
  TextureFormat local_5e8;
  VkMemoryType VStack_5e0;
  VkMemoryType local_5d8;
  undefined1 local_3e0 [24];
  undefined1 local_3c8 [196];
  VkMemoryType local_304;
  VertexShader local_1c0;
  Program local_188;
  ColorFragmentShader local_170;
  ReferenceRenderer local_128;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Move<vk::VkCommandBuffer_s_*> *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_630 = __return_storage_ptr__;
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar10 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  uStack_70 = 0;
  local_58 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 4;
  uStack_50 = 1;
  local_48 = &this->m_cmdBuffer;
  VVar4 = (*pDVar8->_vptr_DeviceInterface[0x14])(pDVar8,pVVar9,1,&this->m_fence);
  ::vk::checkResult(VVar4,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x310);
  VVar4 = (*pDVar8->_vptr_DeviceInterface[2])
                    (pDVar8,pVVar10,1,&local_78,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x311);
  VVar4 = (*pDVar8->_vptr_DeviceInterface[0x16])
                    (pDVar8,pVVar9,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar4,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x312);
  local_650 = ::vk::mapVkFormat(this->m_colorFormat);
  local_5f0.order = CHANNELORDER_LAST;
  local_5f0.type = CHANNELTYPE_LAST;
  rr::VertexShader::VertexShader(&local_1c0,2,2);
  local_1c0._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00d56310;
  *(undefined8 *)
   local_1c0.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start = 0;
  (local_1c0.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  local_1c0.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_start[1].type = GENERICVECTYPE_FLOAT;
  ColorFragmentShader::ColorFragmentShader(&local_170,&local_650,&local_5f0);
  local_188.geometryShader = (GeometryShader *)0x0;
  local_188.vertexShader = &local_1c0;
  local_188.fragmentShader = &local_170.super_FragmentShader;
  ReferenceRenderer::ReferenceRenderer
            (&local_128,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,&local_650,
             &local_5f0,&local_188);
  lVar12 = 0;
  lVar13 = 0;
  do {
    ReferenceRenderer::getViewportState(&local_128);
    local_3e0._0_8_ = (_func_int **)0x100000000;
    local_3e0._8_8_ = (DeviceInterface *)0x0;
    local_3e0._16_4_ = FILL_BOTTOM;
    local_3e0._20_2_ = VIEWPORTORIENTATION_LAST;
    local_3e0._22_2_ = VIEWPORTORIENTATION_LOWER_LEFT >> 0x10;
    rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)local_3c8);
    local_3c8._160_4_ = 1.0;
    local_3c8._180_4_ = local_5d8.propertyFlags;
    local_3c8._184_4_ = local_5d8.heapIndex;
    local_3c8._164_4_ = local_5e8.order;
    local_3c8._168_4_ = local_5e8.type;
    local_3c8._172_4_ = VStack_5e0.propertyFlags;
    local_3c8._176_4_ = VStack_5e0.heapIndex;
    local_3c8._188_4_ = 1.0;
    local_3c8[0xc0] = false;
    local_304.propertyFlags = 0xffffffff;
    local_304.heapIndex = 0;
    local_3e0._20_2_ = VIEWPORTORIENTATION_LOWER_LEFT;
    local_3e0._22_2_ = VIEWPORTORIENTATION_LOWER_LEFT >> 0x10;
    local_3c8._92_4_ = BLENDMODE_STANDARD;
    local_3c8._100_4_ = mapVkBlendFactor((&this->m_blendStates[0].srcColorBlendFactor)[lVar13 * 2]);
    local_3c8._104_4_ = mapVkBlendFactor((&this->m_blendStates[0].dstColorBlendFactor)[lVar13 * 2]);
    local_3c8._96_4_ = mapVkBlendOp((&this->m_blendStates[0].colorBlendOp)[lVar13 * 2]);
    local_3c8._112_4_ = mapVkBlendFactor((&this->m_blendStates[0].srcAlphaBlendFactor)[lVar13 * 2]);
    local_3c8._116_4_ = mapVkBlendFactor((&this->m_blendStates[0].dstAlphaBlendFactor)[lVar13 * 2]);
    local_3c8._108_4_ = mapVkBlendOp((&this->m_blendStates[0].alphaBlendOp)[lVar13 * 2]);
    local_3c8._120_8_ = 0x3e4ccccd3dcccccd;
    local_3c8._128_8_ = 0x3ecccccd3e99999a;
    mapVkColorComponentFlags
              ((pipeline *)&local_5e8,
               *(VkColorComponentFlags *)
                ((long)&pipeline::(anonymous_namespace)::BlendTest::s_colorWriteMasks + lVar13));
    local_3c8._152_4_ = local_5e8.order;
    pVVar2 = (this->m_vertices).
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<__gnu_cxx::__normal_iterator<vkt::pipeline::Vertex4RGBA*,std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>>,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &local_5e8,(Vertex4RGBA *)((long)(pVVar2->position).m_data + lVar12),
               (Vertex4RGBA *)((long)pVVar2[6].position.m_data + lVar12),(allocator_type *)local_628
              );
    ReferenceRenderer::draw
              (&local_128,(RenderState *)local_3e0,PRIMITIVETYPE_TRIANGLES,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &local_5e8);
    if (local_5e8 != (TextureFormat)0x0) {
      operator_delete((void *)local_5e8,(long)local_5d8 - (long)local_5e8);
    }
    lVar13 = lVar13 + 4;
    lVar12 = lVar12 + 0xc0;
  } while (lVar13 != 0x10);
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar10 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar5 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&local_5e8,vk,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)local_3e0,pDVar8,pVVar9,
             (VkPhysicalDeviceMemoryProperties *)&local_5e8);
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      &local_5e8,pDVar8,pVVar9,pVVar10,dVar5,(Allocator *)local_3e0,
                      (VkImage)(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,this->m_colorFormat,&this->m_renderSize);
  local_600.m_data.ptr = (TextureLevel *)local_5e8;
  local_5e8.order = R;
  local_5e8.type = SNORM_INT8;
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&local_5e8);
  lVar12 = 0;
  do {
    (&local_5e8.order)[lVar12] = 0x3c23d70a;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  switch(local_650.type) {
  case SNORM_INT8:
  case UNORM_INT8:
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    if (TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      uVar15 = 0x3d010204;
    }
    else {
      uVar15 = 0;
    }
    if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      uVar15 = 0x3c808081;
    }
    lVar12 = 0;
    do {
      *(undefined4 *)(local_628 + lVar12 * 4) = uVar15;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    break;
  case SNORM_INT16:
  case UNORM_INT16:
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    if (TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      uVar15 = 0x39000100;
    }
    else {
      uVar15 = 0;
    }
    if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      uVar15 = 0x38800080;
    }
    lVar12 = 0;
    do {
      *(undefined4 *)(local_628 + lVar12 * 4) = uVar15;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    break;
  case SNORM_INT32:
  case UNORM_INT32:
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    if (TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      uVar15 = 0x31000000;
    }
    else {
      uVar15 = 0;
    }
    lVar12 = 0;
    do {
      *(undefined4 *)(local_628 + lVar12 * 4) = uVar15;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    break;
  default:
    goto switchD_004ab665_caseD_5;
  case UNORM_BYTE_44:
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    TVar7 = tcu::getTextureChannelClass(local_650.type);
    CVar16 = 0x3f124925;
    CVar14 = 0x3f124925;
    if (TVar6 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      CVar14 = R;
    }
    local_5e8.order = 0x3e888889;
    if (TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_5e8.order = CVar14;
    }
    if (TVar7 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      CVar16 = SNORM_INT8;
    }
    local_5e8.type = 0x3e888889;
    if (TVar7 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_5e8.type = CVar16;
    }
    VStack_5e0.propertyFlags = 0x3f800000;
    VStack_5e0.heapIndex = 0x3f800000;
    goto switchD_004ab665_caseD_5;
  case UNORM_SHORT_565:
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    if (TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      CVar14 = 0x3e888889;
    }
    else {
      CVar14 = R;
    }
    if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      CVar14 = 0x3e042108;
    }
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    TVar7 = tcu::getTextureChannelClass(local_650.type);
    dVar5 = 0;
    local_5e8.type = 0x3e042108;
    if (TVar6 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_5e8.type = SNORM_INT8;
    }
    if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_5e8.type = 0x3d820821;
    }
    if (TVar7 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      dVar5 = 0x3e888889;
    }
    VStack_5e0.propertyFlags = 0x3e042108;
    if (TVar7 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      VStack_5e0.propertyFlags = dVar5;
    }
    local_5e8.order = CVar14;
    goto LAB_004abcb6;
  case UNORM_SHORT_555:
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    if (TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      CVar14 = 0x3e888889;
    }
    else {
      CVar14 = R;
    }
    if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      CVar14 = 0x3e042108;
    }
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    TVar7 = tcu::getTextureChannelClass(local_650.type);
    dVar5 = 0x3e888889;
    CVar16 = 0x3e888889;
    if (TVar6 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      CVar16 = SNORM_INT8;
    }
    local_5e8.type = 0x3e042108;
    if (TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_5e8.type = CVar16;
    }
    if (TVar7 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      dVar5 = 0;
    }
    VStack_5e0.propertyFlags = 0x3e042108;
    if (TVar7 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      VStack_5e0.propertyFlags = dVar5;
    }
    local_5e8.order = CVar14;
LAB_004abcb6:
    VStack_5e0.heapIndex = 0x3f800000;
    goto switchD_004ab665_caseD_5;
  case UNORM_SHORT_4444:
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    if (TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      uVar15 = 0x3f124925;
    }
    else {
      uVar15 = 0;
    }
    if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      uVar15 = 0x3e888889;
    }
    lVar12 = 0;
    do {
      *(undefined4 *)(local_628 + lVar12 * 4) = uVar15;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    break;
  case UNORM_SHORT_5551:
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    if (TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      CVar14 = 0x3e888889;
    }
    else {
      CVar14 = R;
    }
    if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      CVar14 = 0x3e042108;
    }
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    TVar7 = tcu::getTextureChannelClass(local_650.type);
    dVar5 = 0x3e888889;
    CVar16 = 0x3e888889;
    if (TVar6 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      CVar16 = SNORM_INT8;
    }
    local_5e8.type = 0x3e042108;
    if (TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_5e8.type = CVar16;
    }
    if (TVar7 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      dVar5 = 0;
    }
    VStack_5e0.propertyFlags = 0x3e042108;
    if (TVar7 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      VStack_5e0.propertyFlags = dVar5;
    }
    local_5e8.order = CVar14;
    VStack_5e0.heapIndex = 0x3dcccccd;
    goto switchD_004ab665_caseD_5;
  case SNORM_INT_1010102_REV:
  case UNORM_INT_1010102_REV:
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    if (TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      CVar14 = 0x3c004020;
    }
    else {
      CVar14 = R;
    }
    if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      CVar14 = 0x3b802008;
    }
    TVar6 = tcu::getTextureChannelClass(local_650.type);
    TVar7 = tcu::getTextureChannelClass(local_650.type);
    dVar5 = 0x3c004020;
    CVar16 = 0x3c004020;
    if (TVar6 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      CVar16 = SNORM_INT8;
    }
    local_5e8.type = 0x3b802008;
    if (TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_5e8.type = CVar16;
    }
    if (TVar7 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      dVar5 = 0;
    }
    VStack_5e0.propertyFlags = 0x3b802008;
    if (TVar7 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      VStack_5e0.propertyFlags = dVar5;
    }
    local_5e8.order = CVar14;
    VStack_5e0.heapIndex = 0x3eae147b;
    goto switchD_004ab665_caseD_5;
  case UNSIGNED_INT_11F_11F_10F_REV:
    local_5e8.order = 0x3ca3d70a;
    local_5e8.type = 0x3ca3d70a;
    VStack_5e0.propertyFlags = 0x3d800000;
    goto LAB_004ab7bf;
  case UNSIGNED_INT_999_E5_REV:
    local_5e8.order = 0x3d4ccccd;
    local_5e8.type = 0x3d4ccccd;
    VStack_5e0.propertyFlags = 0x3d4ccccd;
LAB_004ab7bf:
    VStack_5e0.heapIndex = 0x3f800000;
    goto switchD_004ab665_caseD_5;
  case HALF_FLOAT:
    lVar12 = 0;
    do {
      *(undefined4 *)(local_628 + lVar12 * 4) = 0x3ba3d70a;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    break;
  case FLOAT:
    lVar12 = 0;
    do {
      *(undefined4 *)(local_628 + lVar12 * 4) = 0x3727c5ac;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
  }
  local_5e8.order = local_628._0_4_;
  local_5e8.type = local_628._4_4_;
  VStack_5e0.propertyFlags = local_628._8_4_;
  VStack_5e0.heapIndex = local_628._12_4_;
switchD_004ab665_caseD_5:
  if ((local_650.order & ~A) == BGR) {
    local_648.type = local_5e8.type;
    local_648.order = VStack_5e0.propertyFlags;
    VStack_640.heapIndex = VStack_5e0.heapIndex;
    VStack_640.propertyFlags = local_5e8.order;
  }
  else {
    local_648 = local_5e8;
    VStack_640 = VStack_5e0;
  }
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ReferenceRenderer::getAccess((PixelBufferAccess *)&local_5e8,&local_128);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_628,local_600.m_data.ptr);
  bVar3 = tcu::floatThresholdCompare
                    (log,"FloatImageCompare","Image comparison",(ConstPixelBufferAccess *)&local_5e8
                     ,(ConstPixelBufferAccess *)local_628,(Vec4 *)&local_648,COMPARE_LOG_RESULT);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&local_600);
  pTVar11 = local_630;
  pp_Var1 = (_func_int **)(local_3e0 + 0x10);
  local_3e0._0_8_ = pp_Var1;
  if (bVar3) {
    local_5e8.order = sBGR|sRGB;
    local_5e8.type = SNORM_INT8;
    local_3e0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_3e0,(ulong)&local_5e8);
    pTVar11 = local_630;
    local_3e0._16_4_ = local_5e8.order;
    local_3e0._20_2_ = (undefined2)local_5e8.type;
    local_3e0._22_2_ = local_5e8.type._2_2_;
    builtin_strncpy((char *)(local_3e0._0_8_ + 0xe),"atches r",8);
    builtin_strncpy((char *)(local_3e0._0_8_ + 0x16),"eference",8);
    *(undefined4 *)local_3e0._0_8_ = 0x75736552;
    builtin_strncpy((char *)(local_3e0._0_8_ + 4),"lt i",4);
    *(undefined4 *)(local_3e0._0_8_ + 8) = 0x6567616d;
    builtin_strncpy((char *)(local_3e0._0_8_ + 0xc)," mat",4);
    local_3e0._8_4_ = local_5e8.order;
    local_3e0._12_4_ = local_5e8.type;
    *(char *)(local_3e0._0_8_ + (long)local_5e8) = '\0';
    local_630->m_code = QP_TEST_RESULT_PASS;
    (local_630->m_description)._M_dataplus._M_p = (pointer)&(local_630->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_630->m_description,local_3e0._0_8_,
               (char *)((long)local_5e8 + local_3e0._0_8_));
  }
  else {
    local_3e0._16_4_ = 0x67616d49;
    local_3e0._20_2_ = 0x2065;
    local_3e0._22_2_ = 0x696d;
    local_3c8._0_6_ = 0x686374616d73;
    local_3e0._8_4_ = sRGB;
    local_3e0._12_4_ = SNORM_INT8;
    local_3c8[6] = 0;
    local_630->m_code = QP_TEST_RESULT_FAIL;
    (local_630->m_description)._M_dataplus._M_p = (pointer)&(local_630->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_630->m_description,pp_Var1);
  }
  if ((_func_int **)local_3e0._0_8_ != pp_Var1) {
    operator_delete((void *)local_3e0._0_8_,
                    CONCAT26(local_3e0._22_2_,CONCAT24(local_3e0._20_2_,local_3e0._16_4_)) + 1);
  }
  ReferenceRenderer::~ReferenceRenderer(&local_128);
  rr::FragmentShader::~FragmentShader(&local_170.super_FragmentShader);
  rr::VertexShader::~VertexShader(&local_1c0);
  return pTVar11;
}

Assistant:

tcu::TestStatus BlendTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	return verifyImage();
}